

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.c
# Opt level: O1

void al_destroy_shader(ALLEGRO_SHADER *shader)

{
  _Bool _Var1;
  long *plVar2;
  ulong uVar3;
  ALLEGRO_BITMAP *bmp;
  ALLEGRO_BITMAP *local_20;
  
  if (shader != (ALLEGRO_SHADER *)0x0) {
    local_20 = al_get_target_bitmap();
    if (local_20 != (ALLEGRO_BITMAP *)0x0) {
      _Var1 = _al_vector_contains(&shader->bitmaps,&local_20);
      if (_Var1) {
        _Var1 = _al_trace_prefix("shader",0,
                                 "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/shader.c"
                                 ,0xd2,"al_destroy_shader");
        if (_Var1) {
          _al_trace_suffix("implicitly unusing shader on target bitmap\n");
        }
        al_use_shader((ALLEGRO_SHADER *)0x0);
      }
    }
    _al_unregister_destructor(_al_dtor_list,shader->dtor_item);
    al_ustr_free(shader->vertex_copy);
    uVar3 = 0;
    shader->vertex_copy = (ALLEGRO_USTR *)0x0;
    al_ustr_free(shader->pixel_copy);
    shader->pixel_copy = (ALLEGRO_USTR *)0x0;
    al_ustr_free(shader->log);
    shader->log = (ALLEGRO_USTR *)0x0;
    if ((shader->bitmaps)._size != 0) {
      do {
        plVar2 = (long *)_al_vector_ref(&shader->bitmaps,(uint)uVar3);
        *(undefined8 *)(*plVar2 + 0x170) = 0;
        uVar3 = (ulong)((uint)uVar3 + 1);
      } while (uVar3 < (shader->bitmaps)._size);
    }
    _al_vector_free(&shader->bitmaps);
    (*shader->vt->destroy_shader)(shader);
  }
  return;
}

Assistant:

void al_destroy_shader(ALLEGRO_SHADER *shader)
{
   ALLEGRO_BITMAP *bmp;
   unsigned i;

   if (!shader)
      return;

   /* As a convenience, implicitly unuse the shader on the target bitmap
    * if currently used.
    */
   bmp = al_get_target_bitmap();
   if (bmp && _al_vector_contains(&shader->bitmaps, &bmp)) {
      ALLEGRO_DEBUG("implicitly unusing shader on target bitmap\n");
      al_use_shader(NULL);
   }

   _al_unregister_destructor(_al_dtor_list, shader->dtor_item);

   al_ustr_free(shader->vertex_copy);
   shader->vertex_copy = NULL;
   al_ustr_free(shader->pixel_copy);
   shader->pixel_copy = NULL;
   al_ustr_free(shader->log);
   shader->log = NULL;

   /* Clear references to this shader from all bitmaps. */
   for (i = 0; i < _al_vector_size(&shader->bitmaps); i++) {
      ALLEGRO_BITMAP **slot = _al_vector_ref(&shader->bitmaps, i);
      ALLEGRO_BITMAP *bitmap = *slot;
      ASSERT(bitmap->shader == shader);
      bitmap->shader = NULL;
   }
   _al_vector_free(&shader->bitmaps);

   shader->vt->destroy_shader(shader);
}